

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_opcode_ss(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStack_b0;
  char acStack_a8 [8];
  size_t local_a0;
  char local_98 [8];
  char src1 [64];
  char src0 [64];
  char *opcode_local;
  Context *ctx_local;
  
  local_a0 = 0x40;
  uStack_b0 = 0x124480;
  make_D3D_srcarg_string(ctx,0,src1 + 0x38,0x40);
  uStack_b0 = 0x12449c;
  make_D3D_srcarg_string(ctx,1,local_98,local_a0);
  uStack_b0 = 0x1244a5;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_b0 + lVar1) = 0x1244bf;
  pcVar3 = lowercase(acStack_a8 + lVar1,opcode);
  pcVar4 = "";
  if (ctx->coissue != 0) {
    pcVar4 = "+";
  }
  *(undefined8 *)((long)&uStack_b0 + lVar1) = 0x124503;
  output_line(ctx,"%s%s %s, %s",pcVar4,pcVar3,src1 + 0x38,local_98);
  return;
}

Assistant:

static void emit_D3D_opcode_ss(Context *ctx, const char *opcode)
{
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s %s, %s", ctx->coissue ? "+" : "", opcode, src0, src1);
}